

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O3

void av1_cnn_convolve_no_maxpool_padding_valid_avx2
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int channel_step)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  float *pfVar9;
  float *pfVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  long lVar29;
  undefined1 (*pauVar30) [32];
  long lVar31;
  undefined1 *puVar32;
  undefined1 (*pauVar33) [32];
  long lVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  float *pfVar39;
  int iVar40;
  long lVar41;
  uint uVar42;
  ulong uVar43;
  float *pfVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float in_register_0000129c;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 in_ZMM3 [64];
  float in_register_0000131c;
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  long local_358;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [4];
  float fStack_1bc;
  undefined8 uStack_1b8;
  float afStack_1b0 [2];
  undefined8 uStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [4];
  float afStack_11c [7];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [4];
  float afStack_7c [19];
  
  auVar49 = _DAT_00572160;
  auVar12 = _DAT_00572140;
  if (layer_config->filter_width == 2) {
    if (((layer_config->filter_height == 2) && (layer_config->skip_width == 2)) &&
       (layer_config->skip_height == 2)) {
      if (in_height == 0x10 && in_width == 0x10) {
        uVar38 = (ulong)(uint)layer_config->out_channels;
        if (layer_config->out_channels <= start_idx) {
          return;
        }
        lVar31 = (long)cstep;
        lVar34 = (long)in_stride;
        lVar36 = (long)start_idx;
        do {
          fVar45 = layer_config->bias[lVar36];
          lVar29 = 0;
          do {
            *(float *)(local_1c0 + lVar29) = fVar45;
            *(float *)(local_1c0 + lVar29 + 4) = fVar45;
            *(float *)(local_1c0 + lVar29 + 8) = fVar45;
            *(float *)(local_1c0 + lVar29 + 0xc) = fVar45;
            *(float *)(local_1c0 + lVar29 + 0x10) = fVar45;
            *(float *)(local_1c0 + lVar29 + 0x14) = fVar45;
            *(float *)(local_1c0 + lVar29 + 0x18) = fVar45;
            *(float *)(local_1c0 + lVar29 + 0x1c) = fVar45;
            lVar29 = lVar29 + 0x20;
          } while (lVar29 != 0x100);
          iVar7 = layer_config->in_channels;
          if (0 < (long)iVar7) {
            pfVar9 = layer_config->weights;
            lVar29 = 0;
            do {
              lVar41 = lVar29 * (int)uVar38 + lVar36;
              auVar53 = vinsertps_avx(ZEXT416((uint)pfVar9[lVar41]),
                                      ZEXT416((uint)pfVar9[lVar31 + lVar41]),0x10);
              auVar47._4_4_ = 0;
              auVar47._0_4_ = pfVar9[lVar31 * 2 + lVar41];
              auVar47._8_4_ = pfVar9[lVar31 * 2 + lVar41];
              auVar47._12_4_ = 0;
              auVar47 = vinsertps_avx(auVar47,ZEXT416((uint)pfVar9[lVar31 * 3 + lVar41]),0x30);
              auVar12 = vpermpd_avx2(ZEXT1632(auVar47),0x55);
              pfVar39 = input[lVar29] + 8;
              lVar41 = 0;
              do {
                fVar45 = auVar53._0_4_;
                fVar46 = auVar53._4_4_;
                pfVar10 = pfVar39 + lVar34 + -8;
                auVar49._0_4_ = fVar45 * pfVar39[-8] + auVar12._0_4_ * *pfVar10;
                auVar49._4_4_ = fVar46 * pfVar39[-7] + auVar12._4_4_ * pfVar10[1];
                auVar49._8_4_ = fVar45 * pfVar39[-6] + auVar12._8_4_ * pfVar10[2];
                auVar49._12_4_ = fVar46 * pfVar39[-5] + auVar12._12_4_ * pfVar10[3];
                auVar49._16_4_ = fVar45 * pfVar39[-4] + auVar12._16_4_ * pfVar10[4];
                auVar49._20_4_ = fVar46 * pfVar39[-3] + auVar12._20_4_ * pfVar10[5];
                auVar49._24_4_ = fVar45 * pfVar39[-2] + auVar12._24_4_ * pfVar10[6];
                auVar49._28_4_ = in_register_0000129c + in_register_0000131c;
                pfVar10 = pfVar39 + lVar34;
                auVar51._0_4_ = fVar45 * *pfVar39 + auVar12._0_4_ * *pfVar10;
                auVar51._4_4_ = fVar46 * pfVar39[1] + auVar12._4_4_ * pfVar10[1];
                auVar51._8_4_ = fVar45 * pfVar39[2] + auVar12._8_4_ * pfVar10[2];
                auVar51._12_4_ = fVar46 * pfVar39[3] + auVar12._12_4_ * pfVar10[3];
                auVar51._16_4_ = fVar45 * pfVar39[4] + auVar12._16_4_ * pfVar10[4];
                auVar51._20_4_ = fVar46 * pfVar39[5] + auVar12._20_4_ * pfVar10[5];
                auVar51._24_4_ = fVar45 * pfVar39[6] + auVar12._24_4_ * pfVar10[6];
                auVar51._28_4_ = in_ZMM3._28_4_ + in_register_0000131c;
                in_ZMM3 = ZEXT3264(auVar51);
                auVar49 = vhaddps_avx(auVar49,auVar51);
                auVar49 = vpermpd_avx2(auVar49,0xd8);
                in_register_0000129c = auVar49._28_4_ + *(float *)(local_1c0 + lVar41 + 0x1c);
                *(float *)(local_1c0 + lVar41) = auVar49._0_4_ + *(float *)(local_1c0 + lVar41);
                *(float *)(local_1c0 + lVar41 + 4) =
                     auVar49._4_4_ + *(float *)(local_1c0 + lVar41 + 4);
                *(float *)(local_1c0 + lVar41 + 8) =
                     auVar49._8_4_ + *(float *)(local_1c0 + lVar41 + 8);
                *(float *)(local_1c0 + lVar41 + 0xc) =
                     auVar49._12_4_ + *(float *)(local_1c0 + lVar41 + 0xc);
                *(float *)(local_1c0 + lVar41 + 0x10) =
                     auVar49._16_4_ + *(float *)(local_1c0 + lVar41 + 0x10);
                *(float *)(local_1c0 + lVar41 + 0x14) =
                     auVar49._20_4_ + *(float *)(local_1c0 + lVar41 + 0x14);
                *(float *)(local_1c0 + lVar41 + 0x18) =
                     auVar49._24_4_ + *(float *)(local_1c0 + lVar41 + 0x18);
                *(float *)(local_1c0 + lVar41 + 0x1c) = in_register_0000129c;
                pfVar39 = pfVar39 + lVar34 * 2;
                lVar41 = lVar41 + 0x20;
              } while (lVar41 != 0x100);
              lVar29 = lVar29 + 1;
            } while (lVar29 != iVar7);
          }
          lVar29 = 0;
          lVar41 = 0;
          do {
            uVar6 = *(undefined8 *)(local_1c0 + lVar41 + 8);
            uVar27 = *(undefined8 *)(local_1c0 + lVar41 + 0x10);
            uVar28 = *(undefined8 *)(local_1c0 + lVar41 + 0x18);
            puVar5 = (undefined8 *)((long)output[lVar36] + lVar29);
            *puVar5 = *(undefined8 *)(local_1c0 + lVar41);
            puVar5[1] = uVar6;
            puVar5[2] = uVar27;
            puVar5[3] = uVar28;
            lVar41 = lVar41 + 0x20;
            lVar29 = lVar29 + (long)out_stride * 4;
          } while (lVar41 != 0x100);
          lVar36 = lVar36 + channel_step;
          uVar38 = (ulong)layer_config->out_channels;
        } while (lVar36 < (long)uVar38);
        return;
      }
      if (in_height == 8 && in_width == 8) {
        uVar38 = (ulong)(uint)layer_config->out_channels;
        if (layer_config->out_channels <= start_idx) {
          return;
        }
        lVar31 = (long)cstep;
        lVar34 = (long)start_idx;
        do {
          local_1c0 = (undefined1  [4])layer_config->bias[lVar34];
          fStack_1bc = (float)local_1c0;
          uStack_1b8._0_4_ = (float)local_1c0;
          uStack_1b8._4_4_ = (float)local_1c0;
          afStack_1b0[0] = (float)local_1c0;
          afStack_1b0[1] = (float)local_1c0;
          uStack_1a8._0_4_ = (float)local_1c0;
          uStack_1a8._4_4_ = (float)local_1c0;
          local_1a0._4_4_ = local_1c0;
          local_1a0._0_4_ = local_1c0;
          fStack_198 = (float)local_1c0;
          fStack_194 = (float)local_1c0;
          fStack_190 = (float)local_1c0;
          fStack_18c = (float)local_1c0;
          fStack_188 = (float)local_1c0;
          fStack_184 = (float)local_1c0;
          iVar7 = layer_config->in_channels;
          fVar45 = (float)local_1c0;
          fVar46 = (float)local_1c0;
          fVar14 = (float)local_1c0;
          fVar15 = (float)local_1c0;
          fVar16 = (float)local_1c0;
          fVar17 = (float)local_1c0;
          fVar18 = (float)local_1c0;
          fVar19 = (float)local_1c0;
          fVar20 = (float)local_1c0;
          fVar21 = (float)local_1c0;
          fVar22 = (float)local_1c0;
          fVar23 = (float)local_1c0;
          fVar24 = (float)local_1c0;
          fVar25 = (float)local_1c0;
          fVar26 = (float)local_1c0;
          if (0 < (long)iVar7) {
            pfVar9 = layer_config->weights;
            lVar36 = 0;
            do {
              lVar29 = lVar36 * (int)uVar38 + lVar34;
              auVar53 = vinsertps_avx(ZEXT416((uint)pfVar9[lVar29]),
                                      ZEXT416((uint)pfVar9[lVar31 + lVar29]),0x10);
              auVar48._4_4_ = 0;
              auVar48._0_4_ = pfVar9[lVar31 * 2 + lVar29];
              auVar48._8_4_ = pfVar9[lVar31 * 2 + lVar29];
              auVar48._12_4_ = 0;
              auVar47 = vinsertps_avx(auVar48,ZEXT416((uint)pfVar9[lVar31 * 3 + lVar29]),0x30);
              auVar12 = vpermpd_avx2(ZEXT1632(auVar47),0x55);
              pfVar39 = input[lVar36];
              lVar29 = 0;
              lVar41 = 0;
              do {
                pfVar44 = pfVar39 + lVar41 * in_stride;
                fVar45 = auVar53._0_4_;
                fVar46 = auVar53._4_4_;
                pfVar10 = pfVar44 + in_stride;
                auVar50._0_4_ = fVar45 * *pfVar44 + auVar12._0_4_ * *pfVar10;
                auVar50._4_4_ = fVar46 * pfVar44[1] + auVar12._4_4_ * pfVar10[1];
                auVar50._8_4_ = fVar45 * pfVar44[2] + auVar12._8_4_ * pfVar10[2];
                auVar50._12_4_ = fVar46 * pfVar44[3] + auVar12._12_4_ * pfVar10[3];
                auVar50._16_4_ = fVar45 * pfVar44[4] + auVar12._16_4_ * pfVar10[4];
                auVar50._20_4_ = fVar46 * pfVar44[5] + auVar12._20_4_ * pfVar10[5];
                auVar50._24_4_ = fVar45 * pfVar44[6] + auVar12._24_4_ * pfVar10[6];
                auVar50._28_4_ = in_register_0000129c + in_ZMM3._28_4_;
                pfVar10 = pfVar44 + in_stride * 2;
                pfVar44 = pfVar44 + in_stride * 3;
                auVar52._0_4_ = fVar45 * *pfVar10 + auVar12._0_4_ * *pfVar44;
                auVar52._4_4_ = fVar46 * pfVar10[1] + auVar12._4_4_ * pfVar44[1];
                auVar52._8_4_ = fVar45 * pfVar10[2] + auVar12._8_4_ * pfVar44[2];
                auVar52._12_4_ = fVar46 * pfVar10[3] + auVar12._12_4_ * pfVar44[3];
                auVar52._16_4_ = fVar45 * pfVar10[4] + auVar12._16_4_ * pfVar44[4];
                auVar52._20_4_ = fVar46 * pfVar10[5] + auVar12._20_4_ * pfVar44[5];
                auVar52._24_4_ = fVar45 * pfVar10[6] + auVar12._24_4_ * pfVar44[6];
                auVar52._28_4_ = in_ZMM3._28_4_ + in_register_0000131c;
                in_ZMM3 = ZEXT3264(auVar52);
                auVar49 = vhaddps_avx(auVar50,auVar52);
                auVar49 = vpermpd_avx2(auVar49,0xd8);
                in_register_0000129c = auVar49._28_4_ + *(float *)(local_1c0 + lVar29 + 0x1c);
                *(float *)(local_1c0 + lVar29) = auVar49._0_4_ + *(float *)(local_1c0 + lVar29);
                *(float *)(local_1c0 + lVar29 + 4) =
                     auVar49._4_4_ + *(float *)(local_1c0 + lVar29 + 4);
                *(float *)(local_1c0 + lVar29 + 8) =
                     auVar49._8_4_ + *(float *)(local_1c0 + lVar29 + 8);
                *(float *)(local_1c0 + lVar29 + 0xc) =
                     auVar49._12_4_ + *(float *)(local_1c0 + lVar29 + 0xc);
                *(float *)(local_1c0 + lVar29 + 0x10) =
                     auVar49._16_4_ + *(float *)(local_1c0 + lVar29 + 0x10);
                *(float *)(local_1c0 + lVar29 + 0x14) =
                     auVar49._20_4_ + *(float *)(local_1c0 + lVar29 + 0x14);
                *(float *)(local_1c0 + lVar29 + 0x18) =
                     auVar49._24_4_ + *(float *)(local_1c0 + lVar29 + 0x18);
                *(float *)(local_1c0 + lVar29 + 0x1c) = in_register_0000129c;
                lVar29 = lVar29 + 0x20;
                lVar41 = 4;
              } while (lVar29 != 0x40);
              lVar36 = lVar36 + 1;
            } while (lVar36 != iVar7);
            fVar45 = fStack_1bc;
            fVar46 = (float)uStack_1b8;
            fVar14 = uStack_1b8._4_4_;
            fVar15 = afStack_1b0[0];
            fVar16 = afStack_1b0[1];
            fVar17 = (float)uStack_1a8;
            fVar18 = uStack_1a8._4_4_;
            fVar19 = (float)local_1a0._0_4_;
            fVar20 = (float)local_1a0._4_4_;
            fVar21 = fStack_198;
            fVar22 = fStack_194;
            fVar23 = fStack_190;
            fVar24 = fStack_18c;
            fVar25 = fStack_188;
            fVar26 = fStack_184;
          }
          pfVar9 = output[lVar34];
          *pfVar9 = (float)local_1c0;
          pfVar9[1] = fVar45;
          pfVar9[2] = fVar46;
          pfVar9[3] = fVar14;
          pfVar9[4] = fVar15;
          pfVar9[5] = fVar16;
          pfVar9[6] = fVar17;
          pfVar9[7] = fVar18;
          pfVar9 = output[lVar34] + out_stride * 2;
          *pfVar9 = fVar19;
          pfVar9[1] = fVar20;
          pfVar9[2] = fVar21;
          pfVar9[3] = fVar22;
          pfVar9[4] = fVar23;
          pfVar9[5] = fVar24;
          pfVar9[6] = fVar25;
          pfVar9[7] = fVar26;
          lVar34 = lVar34 + channel_step;
          uVar38 = (ulong)layer_config->out_channels;
        } while (lVar34 < (long)uVar38);
        return;
      }
    }
  }
  else if (((layer_config->filter_width == 5) && (layer_config->filter_height == 5)) &&
          ((layer_config->skip_width == 4 && (layer_config->skip_height == 4)))) {
    iVar7 = layer_config->out_channels;
    if (iVar7 <= start_idx) {
      return;
    }
    pfVar9 = layer_config->bias;
    uVar8 = layer_config->in_channels;
    lVar31 = (long)in_stride;
    local_358 = (long)start_idx;
    do {
      if (0 < (int)uVar8) {
        fVar45 = pfVar9[local_358];
        pfVar39 = layer_config->weights;
        uVar38 = 0;
        do {
          local_200 = ZEXT1632(ZEXT816(0) << 0x40);
          local_260 = ZEXT1632(ZEXT816(0) << 0x40);
          lVar36 = uVar38 * (long)iVar7 + local_358;
          puVar32 = local_260;
          lVar34 = 0;
          local_240 = local_260;
          local_220 = local_260;
          local_1e0 = local_200;
          do {
            lVar36 = (long)(int)lVar36;
            lVar29 = 0;
            do {
              *(float *)(puVar32 + lVar29 * 4) = pfVar39[lVar36];
              lVar36 = lVar36 + cstep;
              lVar29 = lVar29 + 1;
            } while (lVar29 != 5);
            lVar34 = lVar34 + 1;
            puVar32 = puVar32 + 0x20;
          } while (lVar34 != 5);
          _local_1c0 = vpermps_avx2(_DAT_00572100,local_260);
          _local_1a0 = vpermps_avx2(_DAT_00572100,local_240);
          local_180 = vpermps_avx2(_DAT_00572100,local_220);
          local_160 = vpermps_avx2(_DAT_00572100,local_200);
          local_140 = vpermps_avx2(_DAT_00572100,local_1e0);
          _local_120 = vpermps_avx2(_DAT_00572120,local_260);
          local_100 = vpermps_avx2(_DAT_00572120,local_240);
          local_e0 = vpermps_avx2(_DAT_00572120,local_220);
          local_c0 = vpermps_avx2(_DAT_00572120,local_200);
          _local_80 = local_1e0;
          local_a0 = vpermps_avx2(_DAT_00572120,local_1e0);
          if (4 < in_height) {
            lVar34 = 0;
            lVar36 = 0;
            uVar35 = 0;
            do {
              if (in_width < 0xd) {
                uVar43 = 0;
                uVar37 = 0;
                iVar40 = in_width;
              }
              else {
                lVar29 = uVar35 * (long)out_stride;
                pfVar10 = output[local_358];
                pauVar30 = (undefined1 (*) [32])((long)input[uVar38] + lVar36);
                uVar42 = 0;
                uVar37 = 0;
                iVar13 = in_width;
                do {
                  auVar60 = ZEXT1664(ZEXT816(0) << 0x40);
                  lVar41 = -0xa0;
                  auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
                  pauVar33 = pauVar30;
                  do {
                    auVar51 = vpermilps_avx(*pauVar33,auVar12);
                    auVar50 = vpermps_avx2(auVar49,*(undefined1 (*) [32])(*pauVar33 + 0x1c));
                    auVar59._0_4_ = auVar51._0_4_ * *(float *)(local_120 + lVar41) + auVar60._0_4_;
                    auVar59._4_4_ =
                         auVar51._4_4_ * *(float *)(local_120 + lVar41 + 4) + auVar60._4_4_;
                    auVar59._8_4_ =
                         auVar51._8_4_ * *(float *)(local_120 + lVar41 + 8) + auVar60._8_4_;
                    auVar59._12_4_ =
                         auVar51._12_4_ * *(float *)(local_120 + lVar41 + 0xc) + auVar60._12_4_;
                    auVar59._16_4_ =
                         auVar51._16_4_ * *(float *)(local_120 + lVar41 + 0x10) + auVar60._16_4_;
                    auVar59._20_4_ =
                         auVar51._20_4_ * *(float *)(local_120 + lVar41 + 0x14) + auVar60._20_4_;
                    auVar59._24_4_ =
                         auVar51._24_4_ * *(float *)(local_120 + lVar41 + 0x18) + auVar60._24_4_;
                    auVar59._28_4_ = auVar51._28_4_ + auVar60._28_4_;
                    auVar60 = ZEXT3264(auVar59);
                    auVar54._0_4_ = auVar50._0_4_ * *(float *)(local_80 + lVar41) + auVar55._0_4_;
                    auVar54._4_4_ =
                         auVar50._4_4_ * *(float *)(local_80 + lVar41 + 4) + auVar55._4_4_;
                    auVar54._8_4_ =
                         auVar50._8_4_ * *(float *)(local_80 + lVar41 + 8) + auVar55._8_4_;
                    auVar54._12_4_ =
                         auVar50._12_4_ * *(float *)(local_80 + lVar41 + 0xc) + auVar55._12_4_;
                    auVar54._16_4_ =
                         auVar50._16_4_ * *(float *)(local_80 + lVar41 + 0x10) + auVar55._16_4_;
                    auVar54._20_4_ =
                         auVar50._20_4_ * *(float *)(local_80 + lVar41 + 0x14) + auVar55._20_4_;
                    auVar54._24_4_ =
                         auVar50._24_4_ * *(float *)(local_80 + lVar41 + 0x18) + auVar55._24_4_;
                    auVar54._28_4_ = auVar50._28_4_ + auVar55._28_4_;
                    auVar55 = ZEXT3264(auVar54);
                    pauVar33 = (undefined1 (*) [32])(*pauVar33 + lVar31 * 4);
                    lVar41 = lVar41 + 0x20;
                  } while (lVar41 != 0);
                  auVar51 = vhaddps_avx(auVar59,auVar54);
                  auVar48 = auVar51._0_16_;
                  auVar56._0_4_ = auVar51._16_4_ + auVar59._16_4_;
                  auVar56._4_4_ = auVar51._20_4_ + auVar59._20_4_;
                  auVar56._8_4_ = auVar51._24_4_ + auVar59._24_4_;
                  auVar56._12_4_ = auVar51._28_4_ + auVar59._28_4_;
                  auVar61._0_4_ = auVar59._16_4_ + auVar51._0_4_;
                  auVar61._4_4_ = auVar59._16_4_ + auVar51._4_4_;
                  auVar61._8_4_ = auVar59._16_4_ + auVar51._8_4_;
                  auVar61._12_4_ = auVar59._16_4_ + auVar51._12_4_;
                  auVar53 = vblendps_avx(auVar61,auVar56,2);
                  auVar47 = vshufps_avx(auVar48,auVar48,0xe9);
                  auVar57._0_4_ = auVar47._0_4_ + fVar45 + auVar53._0_4_;
                  auVar57._4_4_ = auVar47._4_4_ + fVar45 + auVar53._4_4_;
                  auVar57._8_4_ = auVar47._8_4_ + fVar45 + auVar53._8_4_;
                  auVar57._12_4_ = auVar47._12_4_ + fVar45 + auVar53._12_4_;
                  uVar6 = vmovlps_avx(auVar57);
                  *(undefined8 *)(pfVar10 + lVar29 + uVar37) = uVar6;
                  auVar53._0_4_ = auVar51._16_4_ + auVar54._16_4_;
                  auVar53._4_4_ = auVar51._20_4_ + auVar54._20_4_;
                  auVar53._8_4_ = auVar51._24_4_ + auVar54._24_4_;
                  auVar53._12_4_ = auVar51._28_4_ + auVar54._28_4_;
                  auVar53 = vshufpd_avx(auVar53,auVar53,1);
                  auVar47 = vshufps_avx(auVar48,auVar48,0xff);
                  pfVar10[lVar29 + uVar37 + 2] = auVar47._0_4_ + fVar45 + auVar53._0_4_;
                  uVar37 = uVar37 + 3;
                  uVar42 = uVar42 + 0xc;
                  iVar40 = iVar13 + -0xc;
                  pauVar30 = (undefined1 (*) [32])(pauVar30[1] + 0x10);
                  bVar11 = 0x18 < iVar13;
                  iVar13 = iVar40;
                } while (bVar11);
                uVar37 = uVar37 & 0xffffffff;
                uVar43 = (ulong)uVar42;
              }
              local_80 = local_1e0._0_4_;
              afStack_7c[0] = local_1e0._4_4_;
              afStack_7c[1] = local_1e0._8_4_;
              afStack_7c[2] = local_1e0._12_4_;
              if (4 < iVar40) {
                iVar13 = (int)uVar37;
                pfVar44 = (float *)(lVar36 + uVar43 * 4 + (long)input[uVar38]);
                pfVar10 = output[local_358];
                do {
                  local_2e0 = local_240._0_4_;
                  fStack_2dc = local_240._4_4_;
                  fStack_2d8 = local_240._8_4_;
                  fStack_2d4 = local_240._12_4_;
                  pfVar1 = pfVar44 + lVar31;
                  pfVar2 = pfVar44 + lVar31 * 2;
                  pfVar3 = pfVar44 + lVar31 * 3;
                  pfVar4 = pfVar44 + lVar31 * 4;
                  local_2c0 = local_260._0_4_;
                  fStack_2bc = local_260._4_4_;
                  fStack_2b8 = local_260._8_4_;
                  fStack_2b4 = local_260._12_4_;
                  auVar58._0_4_ =
                       local_2c0 * *pfVar44 + 0.0 +
                       local_200._0_4_ * *pfVar3 + (float)local_80 * *pfVar4 +
                       local_2e0 * *pfVar1 + local_220._0_4_ * *pfVar2;
                  auVar58._4_4_ =
                       fStack_2bc * pfVar44[1] + 0.0 +
                       local_200._4_4_ * pfVar3[1] + afStack_7c[0] * pfVar4[1] +
                       fStack_2dc * pfVar1[1] + local_220._4_4_ * pfVar2[1];
                  auVar58._8_4_ =
                       fStack_2b8 * pfVar44[2] + 0.0 +
                       local_200._8_4_ * pfVar3[2] + afStack_7c[1] * pfVar4[2] +
                       fStack_2d8 * pfVar1[2] + local_220._8_4_ * pfVar2[2];
                  auVar58._12_4_ =
                       fStack_2b4 * pfVar44[3] + 0.0 +
                       local_200._12_4_ * pfVar3[3] + afStack_7c[2] * pfVar4[3] +
                       fStack_2d4 * pfVar1[3] + local_220._12_4_ * pfVar2[3];
                  auVar53 = vhaddps_avx(auVar58,auVar58);
                  auVar47 = vmovshdup_avx(auVar53);
                  *(float *)((long)pfVar10 + uVar37 * 4 + lVar34) =
                       auVar47._0_4_ +
                       fVar45 + (float)local_1e0._16_4_ * pfVar44[lVar31 * 4 + 4] +
                                (float)local_200._16_4_ * pfVar44[lVar31 * 3 + 4] +
                                (float)local_220._16_4_ * pfVar44[lVar31 * 2 + 4] +
                                (float)local_240._16_4_ * pfVar44[lVar31 + 4] +
                                (float)local_260._16_4_ * pfVar44[4] + 0.0 + auVar53._0_4_;
                  pfVar44 = pfVar44 + 4;
                  uVar37 = uVar37 + 1;
                } while (iVar13 + (iVar40 - 5U >> 2) + 1 != uVar37);
              }
              uVar35 = uVar35 + 1;
              lVar36 = lVar36 + lVar31 * 0x10;
              lVar34 = lVar34 + (long)out_stride * 4;
            } while (uVar35 != (in_height - 5U >> 2) + 1);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != uVar8);
      }
      local_358 = local_358 + channel_step;
    } while (local_358 < iVar7);
    return;
  }
  av1_cnn_convolve_no_maxpool_padding_valid_c
            (input,in_width,in_height,in_stride,layer_config,output,out_stride,start_idx,cstep,
             channel_step);
  return;
}

Assistant:

void av1_cnn_convolve_no_maxpool_padding_valid_avx2(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *layer_config, float **output, int out_stride,
    int start_idx, int cstep, int channel_step) {
  if (layer_config->filter_width == 5 && layer_config->filter_height == 5 &&
      layer_config->skip_width == 4 && layer_config->skip_height == 4) {
    cnn_convolve_no_maxpool_padding_valid_5x5_avx2(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  } else if (layer_config->filter_width == 2 &&
             layer_config->filter_height == 2 &&
             layer_config->skip_width == 2 && layer_config->skip_height == 2) {
    cnn_convolve_no_maxpool_padding_valid_2x2_avx2(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  } else {
    av1_cnn_convolve_no_maxpool_padding_valid_c(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  }
}